

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O2

void __thiscall DIS::IntercomSignalPdu::IntercomSignalPdu(IntercomSignalPdu *this)

{
  RadioCommunicationsFamilyPdu::RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IntercomSignalPdu_001b14d0;
  EntityID::EntityID(&this->_entityID);
  this->_communicationsDeviceID = 0;
  this->_encodingScheme = 0;
  this->_tdlType = 0;
  this->_sampleRate = 0;
  this->_dataLength = 0;
  this->_samples = 0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'\x1f');
  return;
}

Assistant:

IntercomSignalPdu::IntercomSignalPdu()
    : RadioCommunicationsFamilyPdu(), _entityID(), _communicationsDeviceID(0),
      _encodingScheme(0), _tdlType(0), _sampleRate(0), _dataLength(0),
      _samples(0) {
  setPduType(31);
}